

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STAmount.cpp
# Opt level: O0

STAmount * jbcoin::multiply(STAmount *__return_storage_ptr__,STAmount *v1,STAmount *v2,Issue *issue)

{
  Issue *issue_00;
  bool bVar1;
  bool bVar2;
  int64_t iVar3;
  int64_t iVar4;
  SField *name;
  uint64_t uVar5;
  ulong local_100;
  ulong local_f0;
  bool local_c9;
  int local_b8;
  int local_b4;
  int offset2;
  int offset1;
  uint64_t value2;
  uint64_t value1;
  uint64_t maxV;
  uint64_t minV;
  STAmount local_78;
  Issue *local_28;
  Issue *issue_local;
  STAmount *v2_local;
  STAmount *v1_local;
  
  local_28 = issue;
  issue_local = (Issue *)v2;
  v2_local = v1;
  v1_local = __return_storage_ptr__;
  bVar1 = beast::operator==(v1);
  if ((bVar1) || (bVar1 = beast::operator==(issue_local), bVar1)) {
    STAmount::STAmount(__return_storage_ptr__,local_28,0,0,false);
  }
  else {
    bVar2 = STAmount::native(v2_local);
    bVar1 = false;
    local_c9 = false;
    if (bVar2) {
      bVar2 = STAmount::native((STAmount *)issue_local);
      local_c9 = false;
      if (bVar2) {
        STAmount::STAmount(&local_78,local_28,0,0,false);
        bVar1 = true;
        local_c9 = isXRP(&local_78);
      }
    }
    if (bVar1) {
      STAmount::~STAmount(&local_78);
    }
    if (local_c9 == false) {
      value2 = STAmount::mantissa(v2_local);
      _offset2 = STAmount::mantissa((STAmount *)issue_local);
      local_b4 = STAmount::exponent(v2_local);
      local_b8 = STAmount::exponent((STAmount *)issue_local);
      bVar1 = STAmount::native(v2_local);
      if (bVar1) {
        for (; value2 < 1000000000000000; value2 = value2 * 10) {
          local_b4 = local_b4 + -1;
        }
      }
      bVar1 = STAmount::native((STAmount *)issue_local);
      issue_00 = local_28;
      if (bVar1) {
        for (; _offset2 < 1000000000000000; _offset2 = _offset2 * 10) {
          local_b8 = local_b8 + -1;
        }
      }
      uVar5 = muldiv(value2,_offset2,100000000000000);
      bVar1 = STAmount::negative(v2_local);
      bVar2 = STAmount::negative((STAmount *)issue_local);
      STAmount::STAmount(__return_storage_ptr__,issue_00,uVar5 + 7,local_b4 + local_b8 + 0xe,
                         bVar1 != bVar2);
    }
    else {
      iVar3 = getSNValue(v2_local);
      iVar4 = getSNValue((STAmount *)issue_local);
      if (iVar3 < iVar4) {
        local_f0 = getSNValue(v2_local);
      }
      else {
        local_f0 = getSNValue((STAmount *)issue_local);
      }
      iVar3 = getSNValue(v2_local);
      iVar4 = getSNValue((STAmount *)issue_local);
      if (iVar3 < iVar4) {
        local_100 = getSNValue((STAmount *)issue_local);
      }
      else {
        local_100 = getSNValue(v2_local);
      }
      if (3000000000 < local_f0) {
        Throw<std::runtime_error,char_const(&)[22]>((char (*) [22])"Native value overflow");
      }
      if (0x7ce66c50 < (local_100 >> 0x20) * local_f0) {
        Throw<std::runtime_error,char_const(&)[22]>((char (*) [22])"Native value overflow");
      }
      name = STBase::getFName(&v2_local->super_STBase);
      STAmount::STAmount(__return_storage_ptr__,name,local_f0 * local_100,false);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

STAmount
multiply (STAmount const& v1, STAmount const& v2, Issue const& issue)
{
    if (v1 == zero || v2 == zero)
        return STAmount (issue);

    if (v1.native() && v2.native() && isXRP (issue))
    {
        std::uint64_t const minV = getSNValue (v1) < getSNValue (v2)
                ? getSNValue (v1) : getSNValue (v2);
        std::uint64_t const maxV = getSNValue (v1) < getSNValue (v2)
                ? getSNValue (v2) : getSNValue (v1);

        if (minV > 3000000000ull) // sqrt(cMaxNative)
            Throw<std::runtime_error> ("Native value overflow");

        if (((maxV >> 32) * minV) > 2095475792ull) // cMaxNative / 2^32
            Throw<std::runtime_error> ("Native value overflow");

        return STAmount (v1.getFName (), minV * maxV);
    }

    std::uint64_t value1 = v1.mantissa();
    std::uint64_t value2 = v2.mantissa();
    int offset1 = v1.exponent();
    int offset2 = v2.exponent();

    if (v1.native())
    {
        while (value1 < STAmount::cMinValue)
        {
            value1 *= 10;
            --offset1;
        }
    }

    if (v2.native())
    {
        while (value2 < STAmount::cMinValue)
        {
            value2 *= 10;
            --offset2;
        }
    }

    // We multiply the two mantissas (each is between 10^15
    // and 10^16), so their product is in the 10^30 to 10^32
    // range. Dividing their product by 10^14 maintains the
    // precision, by scaling the result to 10^16 to 10^18.
    return STAmount (issue,
        muldiv(value1, value2, tenTo14) + 7,
        offset1 + offset2 + 14,
        v1.negative() != v2.negative());
}